

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

int mk_sched_exit(mk_server *server)

{
  undefined8 *ptr;
  mk_sched_ctx *ctx;
  mk_server *server_local;
  
  ptr = (undefined8 *)server->sched_ctx;
  mk_sched_worker_cb_free(server);
  mk_mem_free((void *)*ptr);
  mk_mem_free(ptr);
  return 0;
}

Assistant:

int mk_sched_exit(struct mk_server *server)
{
    struct mk_sched_ctx *ctx;

    ctx = server->sched_ctx;
    mk_sched_worker_cb_free(server);
    mk_mem_free(ctx->workers);
    mk_mem_free(ctx);

    return 0;
}